

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_unix.c
# Opt level: O2

int w_format_msg_va(char *msg,size_t msg_len,char *fmt,__va_list_tag *args)

{
  uint uVar1;
  uint *puVar2;
  long lVar3;
  size_t __n;
  uint uVar4;
  
  if ((msg != (char *)0x0) && (fmt != (char *)0x0)) {
    puVar2 = (uint *)__errno_location();
    *puVar2 = 0;
    uVar1 = vsnprintf(msg,msg_len,fmt,args);
    if ((int)uVar1 < 0) {
      uVar4 = -(uint)(*puVar2 == 0) | *puVar2;
    }
    else {
      uVar4 = 0;
      if (6 < msg_len && msg_len <= uVar1) {
        __n = 7;
        for (lVar3 = -8; (msg_len != __n && (msg[lVar3 + msg_len] != ' ')); lVar3 = lVar3 + -1) {
          __n = __n + 1;
        }
        strncpy(msg + (msg_len - __n),anon_var_dwarf_5401,__n);
        uVar4 = 0;
      }
    }
    return uVar4;
  }
  _exit(-1);
}

Assistant:

int
w_format_msg_va(
    char *msg,
    size_t msg_len,
    const char *fmt,
    va_list args
)
{
    int result;

    WP_PLATFORM_ASSERT(msg != NULL);
    WP_PLATFORM_ASSERT(fmt != NULL);

    errno = 0;
    result = vsnprintf(msg, msg_len, fmt, args);
    if (result < 0)
    {
        return wp_platform_enforce_error(errno);
    }
    else if ((size_t)result >= msg_len)
    {
        wp_platform_truncate(msg, msg_len);
    }

    return 0;
}